

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_draw_button_text_image
               (nk_command_buffer *out,nk_rect *bounds,nk_rect *label,nk_rect *image,nk_flags state,
               nk_style_button *style,char *str,int len,nk_user_font *font,nk_image *img)

{
  nk_rect r;
  nk_style_item *pnVar1;
  undefined8 in_RCX;
  nk_text *in_RDX;
  undefined8 in_RSI;
  char *in_RDI;
  uint in_R8D;
  long in_R9;
  nk_vec2 img_00;
  nk_command_buffer *unaff_retaddr;
  nk_rect in_stack_00000008;
  nk_style_item *background;
  nk_text text;
  nk_style_button *in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  nk_rect *in_stack_ffffffffffffffb8;
  nk_command_buffer *in_stack_ffffffffffffffc0;
  nk_color nVar2;
  undefined4 uVar3;
  nk_color col;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 uVar4;
  float a;
  int len_00;
  
  len_00 = (int)((ulong)in_RSI >> 0x20);
  uVar4 = (undefined4)in_RCX;
  a = (float)((ulong)in_RCX >> 0x20);
  pnVar1 = nk_draw_button(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                          (nk_flags)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                          in_stack_ffffffffffffffa8);
  if (pnVar1->type == NK_STYLE_ITEM_COLOR) {
    nVar2 = (pnVar1->data).color;
  }
  else {
    nVar2 = *(nk_color *)(in_R9 + 100);
  }
  if ((in_R8D & 0x10) == 0) {
    if ((in_R8D & 0x20) == 0) {
      uVar3 = *(undefined4 *)(in_R9 + 0x68);
    }
    else {
      uVar3 = *(undefined4 *)(in_R9 + 0x70);
    }
  }
  else {
    uVar3 = *(undefined4 *)(in_R9 + 0x6c);
  }
  img_00 = nk_vec2(0.0,0.0);
  col = SUB84((ulong)in_R9 >> 0x20,0);
  nk_widget_text(unaff_retaddr,in_stack_00000008,in_RDI,len_00,in_RDX,(nk_flags)a,
                 (nk_user_font *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8));
  r.y = (float)in_R8D;
  r.x = (float)in_stack_ffffffffffffffd8;
  r.w = (float)uVar4;
  r.h = a;
  nk_draw_image((nk_command_buffer *)CONCAT44(uVar3,nVar2),r,(nk_image *)img_00,col);
  return;
}

Assistant:

NK_LIB void
nk_draw_button_text_image(struct nk_command_buffer *out,
const struct nk_rect *bounds, const struct nk_rect *label,
const struct nk_rect *image, nk_flags state, const struct nk_style_button *style,
const char *str, int len, const struct nk_user_font *font,
const struct nk_image *img)
{
struct nk_text text;
const struct nk_style_item *background;
background = nk_draw_button(out, bounds, state, style);

/* select correct colors */
if (background->type == NK_STYLE_ITEM_COLOR)
text.background = background->data.color;
else text.background = style->text_background;
if (state & NK_WIDGET_STATE_HOVER)
text.text = style->text_hover;
else if (state & NK_WIDGET_STATE_ACTIVED)
text.text = style->text_active;
else text.text = style->text_normal;

text.padding = nk_vec2(0,0);
nk_widget_text(out, *label, str, len, &text, NK_TEXT_CENTERED, font);
nk_draw_image(out, *image, img, nk_white);
}